

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::UniversalTextureEvaluator::operator()
          (UniversalTextureEvaluator *this,SpectrumTextureHandle tex,TextureEvalContext ctx,
          SampledWavelengths lambda)

{
  SampledSpectrum SVar1;
  anon_class_16_2_278d1f37 func;
  SampledWavelengths local_68;
  TextureEvalContext local_48;
  
  local_48.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_48.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_48.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_48.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_48.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_48.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_48.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_48.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_48.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_48.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_48.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_48.dudx = ctx.dudx;
  local_48.dudy = ctx.dudy;
  local_48.dvdx = ctx.dvdx;
  local_48.dvdy = ctx.dvdy;
  local_48.faceIndex = ctx.faceIndex;
  local_68.lambda.values[0] = lambda.lambda.values[0];
  local_68.lambda.values[1] = lambda.lambda.values[1];
  local_68.lambda.values[2] = lambda.lambda.values[2];
  local_68.lambda.values[3] = lambda.lambda.values[3];
  local_68.pdf.values[0] = lambda.pdf.values[0];
  local_68.pdf.values[1] = lambda.pdf.values[1];
  local_68.pdf.values[2] = lambda.pdf.values[2];
  local_68.pdf.values[3] = lambda.pdf.values[3];
  func.lambda = &local_68;
  func.ctx = &local_48;
  SVar1 = TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
          ::
          Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
                      *)tex.
                        super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                        .bits,func);
  return (array<float,_4>)(array<float,_4>)SVar1;
}

Assistant:

SampledSpectrum UniversalTextureEvaluator::operator()(SpectrumTextureHandle tex,
                                                      TextureEvalContext ctx,
                                                      SampledWavelengths lambda) {
    return tex.Evaluate(ctx, lambda);
}